

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
WriteInvalidUTF8String<proto2_unittest::TestAllTypes>::TestBody
          (WriteInvalidUTF8String<proto2_unittest::TestAllTypes> *this)

{
  Descriptor *this_00;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  AlphaNum *in_R8;
  char *wire_buffer_00;
  string_view value;
  internal *local_2d8;
  char *pcStack_2d0;
  WithoutMatchers local_2c1;
  AlphaNum local_2c0;
  string_view local_290;
  AlphaNum local_280;
  AlphaNum local_250;
  string local_220;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_200;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1e8;
  Matcher<absl::lts_20250127::LogSeverity> local_1d0;
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_1b8;
  undefined1 local_168 [8];
  ScopedMockLog log;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  undefined1 local_50 [8];
  OneString input;
  string wire_buffer;
  WriteInvalidUTF8String<proto2_unittest::TestAllTypes> *this_local;
  
  std::__cxx11::string::string((string *)&input.field_0._impl_.data_);
  proto2_unittest::OneString::OneString((OneString *)local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&log.is_capturing_logs_);
  absl::lts_20250127::ScopedMockLog::ScopedMockLog((ScopedMockLog *)local_168,kDisallowUnexpected);
  testing::Matcher<absl::lts_20250127::LogSeverity>::Matcher(&local_1d0,kError);
  testing::Matcher<std::__cxx11::string_const&>::
  Matcher<testing::internal::AnythingMatcher_const&,void>
            ((Matcher<std::__cxx11::string_const&> *)&local_1e8,(AnythingMatcher *)&testing::_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_250,"String field \'");
  this_00 = proto2_unittest::OneString::descriptor();
  local_290 = Descriptor::full_name(this_00);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_280,local_290);
  absl::lts_20250127::AlphaNum::AlphaNum
            (&local_2c0,
             ".data\' contains invalid UTF-8 data when serializing a protocol buffer. Use the \'bytes\' type if you intend to send raw bytes. "
            );
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_220,(lts_20250127 *)&local_250,&local_280,&local_2c0,in_R8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  Matcher(&local_200,&local_220);
  absl::lts_20250127::ScopedMockLog::gmock_Log
            (&local_1b8,(ScopedMockLog *)local_168,&local_1d0,&local_1e8,&local_200);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()(&local_1b8,&local_2c1,(void *)0x0);
  wire_buffer_00 =
       "Log(absl::LogSeverity::kError, testing::_, absl::StrCat(\"String field \'\", TestFixture::OneString::descriptor()->full_name(), \".data\' contains invalid UTF-8 data when \" \"serializing a protocol buffer. Use the \" \"\'bytes\' type if you intend to send raw bytes. \"))"
  ;
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
             ,0x60a,"log",
             "Log(absl::LogSeverity::kError, testing::_, absl::StrCat(\"String field \'\", TestFixture::OneString::descriptor()->full_name(), \".data\' contains invalid UTF-8 data when \" \"serializing a protocol buffer. Use the \" \"\'bytes\' type if you intend to send raw bytes. \"))"
            );
  testing::internal::
  MockSpec<void_(absl::lts_20250127::LogSeverity,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~MockSpec(&local_1b8);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_1e8);
  testing::Matcher<absl::lts_20250127::LogSeverity>::~Matcher(&local_1d0);
  absl::lts_20250127::ScopedMockLog::StartCapturingLogs((ScopedMockLog *)local_168);
  local_2d8 = (internal *)
              Utf8ValidationTest<proto2_unittest::TestAllTypes>::kInvalidUTF8String._M_len;
  pcStack_2d0 = Utf8ValidationTest<proto2_unittest::TestAllTypes>::kInvalidUTF8String._M_str;
  value._M_str = local_50;
  value._M_len = (size_t)pcStack_2d0;
  WriteMessage<proto2_unittest::OneString>
            (local_2d8,value,(OneString *)&input.field_0._impl_.data_,(string *)wire_buffer_00);
  absl::lts_20250127::ScopedMockLog::~ScopedMockLog((ScopedMockLog *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&log.is_capturing_logs_);
  proto2_unittest::OneString::~OneString((OneString *)local_50);
  std::__cxx11::string::~string((string *)&input.field_0._impl_.data_);
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, WriteInvalidUTF8String) {
  std::string wire_buffer;
  typename TestFixture::OneString input;
  std::vector<std::string> errors;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
#ifdef GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
    EXPECT_CALL(
        log,
        Log(absl::LogSeverity::kError, testing::_,
            absl::StrCat("String field '",
                         TestFixture::OneString::descriptor()->full_name(),
                         ".data' contains invalid UTF-8 data when "
                         "serializing a protocol buffer. Use the "
                         "'bytes' type if you intend to send raw bytes. ")));
#else
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
#endif  // GOOGLE_PROTOBUF_UTF8_VALIDATION_ENABLED
    log.StartCapturingLogs();
    WriteMessage(this->kInvalidUTF8String, &input, &wire_buffer);
  }
}